

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O3

RC __thiscall SM_Manager::DropIndex(SM_Manager *this,char *relName,char *attrName)

{
  uint uVar1;
  uint extraout_EAX;
  RC RVar2;
  size_t sVar3;
  AttrCatEntry *aEntry;
  RelCatEntry *rEntry;
  RM_Record attrRec;
  RM_Record relRec;
  AttrCatEntry *local_68;
  RelCatEntry *local_60;
  RM_Record local_58;
  RM_Record local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DropIndex\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   relName =",0xc);
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar3 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   attrName=",0xc);
  if (attrName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar3 = strlen(attrName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,attrName,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  RM_Record::RM_Record(&local_40);
  uVar1 = GetRelEntry(this,relName,&local_40,&local_60);
  if (uVar1 == 0) {
    RM_Record::RM_Record(&local_58);
    uVar1 = FindAttr(this,relName,attrName,&local_58,&local_68);
    if (uVar1 == 0) {
      if (local_68->indexNo == -1) {
        uVar1 = 0x133;
      }
      else {
        IX_Manager::DestroyIndex(this->ixm);
        uVar1 = extraout_EAX;
        if (extraout_EAX == 0) {
          local_68->indexNo = -1;
          local_60->indexCount = local_60->indexCount + -1;
          uVar1 = RM_FileHandle::UpdateRec(&this->relcatFH,&local_40);
          if (uVar1 == 0) {
            uVar1 = RM_FileHandle::UpdateRec(&this->attrcatFH,&local_58);
            if (uVar1 == 0) {
              RVar2 = RM_FileHandle::ForcePages(&this->relcatFH,-1);
              uVar1 = 1;
              if (RVar2 == 0) {
                RVar2 = RM_FileHandle::ForcePages(&this->attrcatFH,-1);
                uVar1 = (uint)(RVar2 != 0);
              }
            }
          }
        }
      }
    }
    RM_Record::~RM_Record(&local_58);
  }
  RM_Record::~RM_Record(&local_40);
  return uVar1;
}

Assistant:

RC SM_Manager::DropIndex(const char *relName,
                         const char *attrName)
{
  cout << "DropIndex\n"
    << "   relName =" << relName << "\n"
    << "   attrName=" << attrName << "\n";

  RC rc = 0;
  RM_Record relRec;
  RelCatEntry *rEntry;
  if((rc = GetRelEntry(relName, relRec, rEntry))) // retrieve relation
    return (rc);

  RM_Record attrRec; // Finds the appropriate attribute
  AttrCatEntry *aEntry;
  if((rc = FindAttr(relName, attrName, attrRec, aEntry))){
    return (rc);
  }

  if((aEntry->indexNo == NO_INDEXES)) // Check that there is actually an index
    return (SM_NOINDEX);
  
  // Destroys the index
  if((rc = ixm.DestroyIndex(relName, aEntry->indexNo)))
    return (rc);

  // Update entries in the relation and attribute records
  aEntry->indexNo = NO_INDEXES;
  rEntry->indexCount--;

  // write both catalog pages back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = attrcatFH.UpdateRec(attrRec)))
    return (rc);
  if((rc = relcatFH.ForcePages() || (rc = attrcatFH.ForcePages())))
    return (rc);

  return (0);
}